

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt slang::SVInt::fromPow2Digits
                (bitwidth_t bits,bool isSigned,bool anyUnknown,uint32_t radix,uint32_t shift,
                span<const_slang::logic_t,_18446744073709551615UL> digits)

{
  ulong *puVar1;
  uint64_t uVar2;
  uint uVar3;
  ulong *puVar4;
  invalid_argument *this;
  byte bVar5;
  sbyte sVar6;
  int iVar7;
  ulong uVar8;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  bitwidth_t bits_00;
  undefined7 in_register_00000031;
  ulong uVar9;
  undefined4 in_register_0000003c;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this_00;
  __extent_storage<18446744073709551615UL> _Var10;
  int in_R9D;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  SVInt SVar18;
  string_view fmt;
  format_args args;
  string local_78;
  ulong local_58 [2];
  uint32_t local_48;
  
  this_00.val._4_4_ = in_register_0000003c;
  this_00.val._0_4_ = bits;
  bits_00 = (bitwidth_t)CONCAT71(in_register_00000031,isSigned);
  bVar17 = SUB41(radix,0);
  allocZeroed((SVInt *)this_00.pVal,bits_00,anyUnknown,bVar17);
  uVar13 = bits_00 + 0x3f >> 6;
  uVar15 = (ulong)(uint)~(-1 << ((byte)in_R9D & 0x1f));
  puVar4 = (ulong *)*this_00.pVal;
  puVar1 = puVar4 + uVar13;
  _Var10 = digits._M_extent._M_extent_value;
  aVar11.values_ = (value<fmt::v11::context> *)0x0;
  uVar8 = 0;
  uVar12 = 0;
  while( true ) {
    aVar11._0_4_ = aVar11._0_4_ - 0x40;
    aVar11._4_4_ = 0;
    do {
      if ((long)_Var10._M_extent_value < 1) {
        if (puVar4 != puVar1) {
          if (uVar12 != 0) {
            *puVar4 = uVar12;
          }
          if ((bVar17 != false) && (uVar8 != 0)) {
            puVar4[uVar13] = uVar8;
          }
        }
        goto LAB_001d219b;
      }
      bVar5 = digits._M_ptr[_Var10._M_extent_value - 1].value;
      uVar14 = uVar15;
      if (bVar5 == 0x80) {
        uVar9 = 0;
      }
      else {
        uVar9 = uVar15;
        if (bVar5 != 0x40) {
          if (shift <= bVar5) {
            this = (invalid_argument *)__cxa_allocate_exception(0x10);
            fmt.size_ = 0x24;
            fmt.data_ = (char *)0x1f;
            args.field_1.args_ = aVar11.args_;
            args.desc_ = (unsigned_long_long)local_58;
            local_58[0] = (ulong)bVar5;
            local_48 = shift;
            ::fmt::v11::vformat_abi_cxx11_
                      (&local_78,(v11 *)"Digit {} too large for radix {}",fmt,args);
            std::invalid_argument::invalid_argument(this,(string *)&local_78);
            __cxa_throw(this,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          uVar9 = (ulong)bVar5;
          uVar14 = 0;
        }
      }
      bVar5 = aVar11._0_1_ + 0x40;
      uVar12 = uVar9 << (bVar5 & 0x3f) | uVar12;
      uVar8 = uVar14 << (bVar5 & 0x3f) | uVar8;
      iVar7 = aVar11._0_4_;
      aVar11._0_4_ = iVar7 + in_R9D;
      aVar11._4_4_ = 0;
      _Var10._M_extent_value = _Var10._M_extent_value - 1;
    } while (iVar7 + in_R9D + 0x40U < 0x40);
    *puVar4 = uVar12;
    if (bVar17 != false) {
      puVar4[uVar13] = uVar8;
    }
    puVar4 = puVar4 + 1;
    if (puVar4 == puVar1) break;
    bVar5 = (byte)in_R9D - (char)aVar11._0_4_;
    uVar12 = uVar9 >> (bVar5 & 0x3f);
    uVar8 = uVar14 >> (bVar5 & 0x3f);
  }
LAB_001d219b:
  clearUnusedBits((SVInt *)this_00.pVal);
  checkUnknown((SVInt *)this_00.pVal);
  uVar8 = extraout_RDX;
  if (*(bool *)(this_00.val + 0xd) == true) {
    uVar3 = in_R9D * (int)digits._M_extent._M_extent_value;
    if (*(bitwidth_t *)(this_00.val + 8) < (uint)(in_R9D * (int)digits._M_extent._M_extent_value)) {
      uVar3 = *(bitwidth_t *)(this_00.val + 8);
    }
    uVar16 = uVar3 >> 6;
    sVar6 = (sbyte)(uVar3 & 0x3f);
    bVar17 = (uVar3 & 0x3f) == 0;
    uVar12 = 0;
    bVar5 = 0x3f;
    if (!bVar17) {
      uVar12 = -1L << sVar6;
      bVar5 = sVar6 - 1;
    }
    uVar8 = (ulong)bVar17;
    uVar3 = uVar16 - bVar17;
    uVar15 = *(ulong *)(*this_00.pVal + (ulong)(uVar3 + uVar13) * 8);
    if (uVar15 >> (bVar5 & 0x3f) != 0) {
      iVar7 = -(uint)bVar17;
      *(ulong *)(*this_00.pVal + (ulong)(uVar3 + uVar13) * 8) = uVar15 | uVar12;
      for (uVar8 = (ulong)(iVar7 + uVar16 + uVar13 + 1); uVar2 = *this_00.pVal,
          (uint)uVar8 < uVar13 * 2; uVar8 = uVar8 + 1) {
        *(undefined8 *)(uVar2 + uVar8 * 8) = 0xffffffffffffffff;
      }
      uVar8 = *(ulong *)(uVar2 + (ulong)uVar3 * 8);
      if (uVar8 >> (bVar5 & 0x3f) != 0) {
        *(ulong *)(uVar2 + (ulong)uVar3 * 8) = uVar8 | uVar12;
        for (uVar8 = (ulong)(uVar16 + iVar7 + 1); (uint)uVar8 < uVar13; uVar8 = uVar8 + 1) {
          *(undefined8 *)(*this_00.pVal + uVar8 * 8) = 0xffffffffffffffff;
        }
      }
      clearUnusedBits((SVInt *)this_00.pVal);
      uVar8 = extraout_RDX_00;
    }
  }
  SVar18.super_SVIntStorage.bitWidth = (int)uVar8;
  SVar18.super_SVIntStorage.signFlag = (bool)(char)(uVar8 >> 0x20);
  SVar18.super_SVIntStorage.unknownFlag = (bool)(char)(uVar8 >> 0x28);
  SVar18.super_SVIntStorage._14_2_ = (short)(uVar8 >> 0x30);
  SVar18.super_SVIntStorage.field_0.val = this_00.val;
  return (SVInt)SVar18.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromPow2Digits(bitwidth_t bits, bool isSigned, bool anyUnknown, uint32_t radix,
                            uint32_t shift, std::span<logic_t const> digits) {

    SVInt result = allocZeroed(bits, isSigned, anyUnknown);

    uint32_t numWords = getNumWords(bits, false);
    uint32_t ones = (1 << shift) - 1;
    uint64_t word = 0;
    uint64_t unknownWord = 0;
    uint64_t* dest = result.pVal;
    uint64_t* endPtr = dest + numWords;
    uint32_t bitPos = 0;

    for (ptrdiff_t i = ptrdiff_t(digits.size()) - 1; i >= 0; i--) {
        logic_t d = digits[size_t(i)];
        uint64_t unknown = 0;
        uint64_t value = d.value;

        if (exactlyEqual(d, logic_t::x)) {
            value = 0;
            unknown = ones;
        }
        else if (exactlyEqual(d, logic_t::z)) {
            value = ones;
            unknown = ones;
        }
        else if (value >= radix) {
            SLANG_THROW(std::invalid_argument(
                fmt::format("Digit {} too large for radix {}", value, radix)));
        }

        word |= value << bitPos;
        unknownWord |= unknown << bitPos;
        bitPos += shift;

        if (bitPos >= BITS_PER_WORD) {
            *dest = word;
            if (anyUnknown)
                *(dest + numWords) = unknownWord;

            dest++;
            if (dest == endPtr)
                break;

            bitPos -= BITS_PER_WORD;
            word = value >> (shift - bitPos);
            unknownWord = unknown >> (shift - bitPos);
        }
    }

    if (dest != endPtr) {
        if (word)
            *dest = word;
        if (anyUnknown && unknownWord)
            *(dest + numWords) = unknownWord;
    }

    result.clearUnusedBits();
    result.checkUnknown();

    if (result.hasUnknown()) {
        // If the most significant bit is X or Z, we need to extend that out to the full range.
        uint32_t givenBits = std::min((uint32_t)digits.size() * shift, result.getBitWidth());
        uint32_t wordBits = givenBits % BITS_PER_WORD;
        uint32_t wordOffset = givenBits / BITS_PER_WORD;
        uint64_t mask = UINT64_MAX;
        if (wordBits)
            mask <<= wordBits;
        else {
            wordBits = 64;
            wordOffset--;
            mask = 0;
        }

        uint32_t topWord = numWords + wordOffset;
        if (result.pVal[topWord] >> (wordBits - 1)) {
            // Unknown bit was set, so now do the extension.
            result.pVal[topWord] |= mask;
            for (topWord++; topWord < numWords * 2; topWord++)
                result.pVal[topWord] = UINT64_MAX;

            if (result.pVal[wordOffset] >> (wordBits - 1)) {
                // The Z bit was set as well, so handle that too.
                result.pVal[wordOffset] |= mask;
                for (wordOffset++; wordOffset < numWords; wordOffset++)
                    result.pVal[wordOffset] = UINT64_MAX;
            }
            result.clearUnusedBits();
        }
    }

    return result;
}